

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_attribute __thiscall
pugi::xml_node::insert_attribute_before(xml_node *this,char_t *name_,xml_attribute *attr)

{
  ulong uVar1;
  xml_node_struct *pxVar2;
  xml_allocator *this_00;
  xml_attribute_struct *pxVar3;
  xml_memory_page *in_RAX;
  xml_attribute_struct *pxVar4;
  xml_attribute_struct *pxVar5;
  xml_attribute_struct **ppxVar6;
  bool bVar7;
  xml_memory_page *page;
  xml_memory_page *local_28;
  
  pxVar2 = this->_root;
  bVar7 = true;
  if (pxVar2 != (xml_node_struct *)0x0) {
    if ((pxVar2->header & 7) == 1) {
      pxVar4 = attr->_attr;
      if (attr->_attr == (xml_attribute_struct *)0x0) {
        return (xml_attribute)(xml_attribute_struct *)0x0;
      }
      goto LAB_001141ea;
    }
    if (pxVar2 != (xml_node_struct *)0x0) {
      bVar7 = (pxVar2->header & 7) != 6;
    }
  }
  pxVar4 = attr->_attr;
  if ((bool)(attr->_attr == (xml_attribute_struct *)0x0 | bVar7)) {
    return (xml_attribute)(xml_attribute_struct *)0x0;
  }
LAB_001141ea:
  do {
    pxVar5 = pxVar4;
    pxVar4 = pxVar5->prev_attribute_c;
  } while (pxVar4->next_attribute != (xml_attribute_struct *)0x0);
  if (pxVar5 != pxVar2->first_attribute) {
    return (xml_attribute)(xml_attribute_struct *)0x0;
  }
  if (pxVar2 == (xml_node_struct *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                  ,0x205,
                  "xml_allocator &pugi::impl::(anonymous namespace)::get_allocator(const xml_node_struct *)"
                 );
  }
  this_00 = *(xml_allocator **)(pxVar2->header & 0xffffffffffffffe0);
  uVar1 = this_00->_busy_size + 0x28;
  if (uVar1 < 0x8001) {
    local_28 = this_00->_root;
    pxVar4 = (xml_attribute_struct *)(local_28->data + this_00->_busy_size);
    this_00->_busy_size = uVar1;
  }
  else {
    local_28 = in_RAX;
    pxVar4 = (xml_attribute_struct *)
             impl::anon_unknown_0::xml_allocator::allocate_memory_oob(this_00,0x28,&local_28);
  }
  pxVar4->header = (uintptr_t)local_28;
  pxVar4->name = (char_t *)0x0;
  pxVar4->value = (char_t *)0x0;
  pxVar4->prev_attribute_c = (xml_attribute_struct *)0x0;
  pxVar4->next_attribute = (xml_attribute_struct *)0x0;
  impl::anon_unknown_0::strcpy_insitu(&pxVar4->name,&pxVar4->header,0x10,name_);
  pxVar5 = attr->_attr;
  pxVar3 = pxVar5->prev_attribute_c;
  ppxVar6 = &this->_root->first_attribute;
  if (pxVar3->next_attribute != (xml_attribute_struct *)0x0) {
    ppxVar6 = &pxVar3->next_attribute;
  }
  *ppxVar6 = pxVar4;
  pxVar4->prev_attribute_c = pxVar3;
  pxVar4->next_attribute = pxVar5;
  pxVar5->prev_attribute_c = pxVar4;
  return (xml_attribute)pxVar4;
}

Assistant:

PUGI__FN xml_attribute xml_node::insert_attribute_before(const char_t* name_, const xml_attribute& attr)
	{
		if ((type() != node_element && type() != node_declaration) || attr.empty()) return xml_attribute();
		
		// check that attribute belongs to *this
		xml_attribute_struct* cur = attr._attr;

		while (cur->prev_attribute_c->next_attribute) cur = cur->prev_attribute_c;

		if (cur != _root->first_attribute) return xml_attribute();

		xml_attribute a(impl::allocate_attribute(impl::get_allocator(_root)));
		if (!a) return xml_attribute();

		a.set_name(name_);

		if (attr._attr->prev_attribute_c->next_attribute)
			attr._attr->prev_attribute_c->next_attribute = a._attr;
		else
			_root->first_attribute = a._attr;
		
		a._attr->prev_attribute_c = attr._attr->prev_attribute_c;
		a._attr->next_attribute = attr._attr;
		attr._attr->prev_attribute_c = a._attr;
				
		return a;
	}